

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O0

void __thiscall cmWorkerPoolInternal::Work(cmWorkerPoolInternal *this,uint workerIndex)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  pointer pJVar4;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  mutex *__m;
  int in_R8D;
  undefined1 local_30 [8];
  unique_lock<std::mutex> uLock;
  JobHandleT jobHandle;
  uint workerIndex_local;
  cmWorkerPoolInternal *this_local;
  
  std::unique_ptr<cmWorkerPool::JobT,std::default_delete<cmWorkerPool::JobT>>::
  unique_ptr<std::default_delete<cmWorkerPool::JobT>,void>
            ((unique_ptr<cmWorkerPool::JobT,std::default_delete<cmWorkerPool::JobT>> *)
             &uLock._M_owns);
  __m = &this->Mutex;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,__m);
  this->WorkersRunning = this->WorkersRunning + 1;
  __buf = extraout_RDX;
  do {
    while( true ) {
      while( true ) {
        if ((this->Aborting & 1U) != 0) {
          uVar2 = this->WorkersRunning - 1;
          this->WorkersRunning = uVar2;
          if (uVar2 == 0) {
            ::cm::uv_async_ptr::send(&this->UVRequestEnd,(int)__m,__buf,(size_t)this,in_R8D);
          }
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
          std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>::~unique_ptr
                    ((unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_> *)
                     &uLock._M_owns);
          return;
        }
        bVar1 = std::
                deque<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
                ::empty(&this->Queue);
        if (!bVar1) break;
        this->WorkersIdle = this->WorkersIdle + 1;
        __m = (mutex *)local_30;
        std::condition_variable::wait((unique_lock *)&this->Condition);
        this->WorkersIdle = this->WorkersIdle - 1;
        __buf = extraout_RDX_00;
      }
      if ((this->FenceProcessing & 1U) != 0) break;
      pvVar3 = std::
               deque<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
               ::front(&this->Queue);
      pJVar4 = std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>::
               operator->(pvVar3);
      bVar1 = cmWorkerPool::JobT::IsFence(pJVar4);
      if (bVar1) break;
LAB_0027698b:
      pvVar3 = std::
               deque<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
               ::front(&this->Queue);
      std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>::operator=
                ((unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_> *)
                 &uLock._M_owns,pvVar3);
      std::
      deque<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
      ::pop_front(&this->Queue);
      this->JobsProcessing = this->JobsProcessing + 1;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_30);
      pJVar4 = std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>::
               operator->((unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>
                           *)&uLock._M_owns);
      cmWorkerPool::JobT::Work(pJVar4,this->Pool,workerIndex);
      __m = (mutex *)0x0;
      std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>::reset
                ((unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_> *)
                 &uLock._M_owns,(pointer)0x0);
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
      this->JobsProcessing = this->JobsProcessing - 1;
      __buf = extraout_RDX_02;
      if ((this->FenceProcessing & 1U) != 0) {
        this->FenceProcessing = false;
        std::condition_variable::notify_all();
        __buf = extraout_RDX_03;
      }
    }
    if (this->JobsProcessing == 0) {
      this->FenceProcessing = true;
      goto LAB_0027698b;
    }
    __m = (mutex *)local_30;
    std::condition_variable::wait((unique_lock *)&this->Condition);
    __buf = extraout_RDX_01;
  } while( true );
}

Assistant:

void cmWorkerPoolInternal::Work(unsigned int workerIndex)
{
  cmWorkerPool::JobHandleT jobHandle;
  std::unique_lock<std::mutex> uLock(Mutex);
  // Increment running workers count
  ++WorkersRunning;
  // Enter worker main loop
  while (true) {
    // Abort on request
    if (Aborting) {
      break;
    }
    // Wait for new jobs
    if (Queue.empty()) {
      ++WorkersIdle;
      Condition.wait(uLock);
      --WorkersIdle;
      continue;
    }

    // Check for fence jobs
    if (FenceProcessing || Queue.front()->IsFence()) {
      if (JobsProcessing != 0) {
        Condition.wait(uLock);
        continue;
      }
      // No jobs get processed. Set the fence job processing flag.
      FenceProcessing = true;
    }

    // Pop next job from queue
    jobHandle = std::move(Queue.front());
    Queue.pop_front();

    // Unlocked scope for job processing
    ++JobsProcessing;
    {
      uLock.unlock();
      jobHandle->Work(Pool, workerIndex); // Process job
      jobHandle.reset();                  // Destroy job
      uLock.lock();
    }
    --JobsProcessing;

    // Was this a fence job?
    if (FenceProcessing) {
      FenceProcessing = false;
      Condition.notify_all();
    }
  }

  // Decrement running workers count
  if (--WorkersRunning == 0) {
    // Last worker thread about to finish. Send libuv event.
    UVRequestEnd.send();
  }
}